

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O1

int __thiscall datadog::Dogstatsd::flush(Dogstatsd *this)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  ssize_t sVar4;
  ostream *poVar5;
  int iVar6;
  string buffer;
  ostringstream statd;
  undefined1 *local_1e8;
  size_t local_1e0;
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long local_1a8;
  string local_1a0 [104];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  iVar6 = 0;
  if (this->buffered == true) {
    if ((this->cmd_buffer).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->cmd_buffer).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar6 = 0;
    }
    else {
      iVar6 = 0;
      do {
        iVar3 = std::ostream::tellp();
        if (0xffbb < (long)iVar3 +
                     (this->cmd_buffer).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length) {
          std::__cxx11::stringbuf::str();
          sVar4 = sendto(this->_sockfd,local_1e8,local_1e0,0,(sockaddr *)&this->_server,0x10);
          local_1c8[0] = local_1b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0]);
          }
          std::ios::clear((int)*(undefined8 *)(local_1a8 + -0x18) + (int)(ostringstream *)&local_1a8
                         );
          if (local_1e8 != local_1d8) {
            operator_delete(local_1e8);
          }
          iVar6 = iVar6 + (int)sVar4;
        }
        pbVar1 = (this->cmd_buffer).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,pbVar1[-1]._M_dataplus._M_p,
                            pbVar1[-1]._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pbVar1 = (this->cmd_buffer).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->cmd_buffer).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
        pcVar2 = pbVar1[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &pbVar1[-1].field_2) {
          operator_delete(pcVar2);
        }
      } while ((this->cmd_buffer).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->cmd_buffer).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::stringbuf::str();
    sVar4 = sendto(this->_sockfd,local_1e8,local_1e0,0,(sockaddr *)&this->_server,0x10);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    iVar6 = iVar6 + (int)sVar4;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return iVar6;
}

Assistant:

int Dogstatsd::flush(){
    int ret = 0;
    std::ostringstream statd;
    if(!buffered) {
      return 0;
    }
    while (!cmd_buffer.empty()) {
      if (static_cast<int>(statd.tellp()) + cmd_buffer.back().length() > optimal_payload) {
        std::string buffer(statd.str());
        ret += sendto( _sockfd, buffer.c_str(), buffer.length(), 
            0, (struct sockaddr *)&_server, sizeof(_server));

        //clear the stringstream
        statd.str("");
        statd.clear();
      }
      statd << cmd_buffer.back() << std::endl;
      cmd_buffer.pop_back();
    }

    std::string buffer(statd.str());
    ret += sendto(_sockfd, buffer.c_str(), buffer.length(), 0, (struct sockaddr *)&_server, sizeof(_server));

    return ret;
  }